

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::setOption(QSocks5SocketEngine *this,SocketOption option,int value)

{
  QTcpSocket *pQVar1;
  QSocks5SocketEnginePrivate *pQVar2;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QSocks5SocketEnginePrivate *d;
  bool local_49;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSocks5SocketEngine *)0x374bf3);
  if ((pQVar2->data == (QSocks5Data *)0x0) || (pQVar2->data->controlSocket == (QTcpSocket *)0x0)) {
    local_49 = false;
  }
  else {
    if (in_ESI == 7) {
      pQVar1 = pQVar2->data->controlSocket;
      QVariant::QVariant(&local_28,in_EDX);
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x120))(pQVar1,0,&local_28);
      QVariant::~QVariant(&local_28);
    }
    if (in_ESI == 8) {
      pQVar1 = pQVar2->data->controlSocket;
      QVariant::QVariant(&local_48,in_EDX);
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x120))(pQVar1,1,&local_48);
      QVariant::~QVariant(&local_48);
    }
    local_49 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::setOption(SocketOption option, int value)
{
    Q_D(QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            d->data->controlSocket->setSocketOption(QAbstractSocket::LowDelayOption, value);
        if (option == QAbstractSocketEngine::KeepAliveOption)
            d->data->controlSocket->setSocketOption(QAbstractSocket::KeepAliveOption, value);
        return true;
    }
    return false;
}